

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall
helics::CommonCore::getPublication(CommonCore *this,LocalFederateId federateID,string_view key)

{
  BaseType BVar1;
  BasicHandleInfo *pBVar2;
  shared_lock<std::shared_mutex> local_30;
  
  local_30._M_pm = &(this->handles).m_mutex;
  local_30._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_30._M_pm)->_M_impl);
  pBVar2 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,key,PUBLICATION);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_30);
  BVar1 = -1700000000;
  if ((pBVar2->local_fed_id).fid == federateID.fid) {
    BVar1 = (pBVar2->handle).handle.hid;
  }
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::getPublication(LocalFederateId federateID, std::string_view key) const
{
    const auto* pub = handles.read(
        [&key](auto& hand) { return hand.getInterfaceHandle(key, InterfaceType::PUBLICATION); });
    if (pub->local_fed_id != federateID) {
        return {};
    }
    return pub->getInterfaceHandle();
}